

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::MasteringMetadata::PayloadSize(MasteringMetadata *this)

{
  uint64 uVar1;
  uint64_t uVar2;
  uint64 local_18;
  uint64_t size;
  MasteringMetadata *this_local;
  
  local_18 = 0;
  if ((this->luminance_max_ != 3.4028235e+38) || (NAN(this->luminance_max_))) {
    local_18 = EbmlElementSize(0x55d9,this->luminance_max_);
  }
  if ((this->luminance_min_ != 3.4028235e+38) || (NAN(this->luminance_min_))) {
    uVar1 = EbmlElementSize(0x55da,this->luminance_min_);
    local_18 = uVar1 + local_18;
  }
  if (this->r_ != (PrimaryChromaticity *)0x0) {
    uVar2 = PrimaryChromaticity::PrimaryChromaticitySize
                      (this->r_,kMkvPrimaryRChromaticityX,kMkvPrimaryRChromaticityY);
    local_18 = uVar2 + local_18;
  }
  if (this->g_ != (PrimaryChromaticity *)0x0) {
    uVar2 = PrimaryChromaticity::PrimaryChromaticitySize
                      (this->g_,kMkvPrimaryGChromaticityX,kMkvPrimaryGChromaticityY);
    local_18 = uVar2 + local_18;
  }
  if (this->b_ != (PrimaryChromaticity *)0x0) {
    uVar2 = PrimaryChromaticity::PrimaryChromaticitySize
                      (this->b_,kMkvPrimaryBChromaticityX,kMkvPrimaryBChromaticityY);
    local_18 = uVar2 + local_18;
  }
  if (this->white_point_ != (PrimaryChromaticity *)0x0) {
    uVar2 = PrimaryChromaticity::PrimaryChromaticitySize
                      (this->white_point_,kMkvWhitePointChromaticityX,kMkvWhitePointChromaticityY);
    local_18 = uVar2 + local_18;
  }
  return local_18;
}

Assistant:

uint64_t MasteringMetadata::PayloadSize() const {
  uint64_t size = 0;

  if (luminance_max_ != kValueNotPresent)
    size += EbmlElementSize(libwebm::kMkvLuminanceMax, luminance_max_);
  if (luminance_min_ != kValueNotPresent)
    size += EbmlElementSize(libwebm::kMkvLuminanceMin, luminance_min_);

  if (r_) {
    size += r_->PrimaryChromaticitySize(libwebm::kMkvPrimaryRChromaticityX,
                                        libwebm::kMkvPrimaryRChromaticityY);
  }
  if (g_) {
    size += g_->PrimaryChromaticitySize(libwebm::kMkvPrimaryGChromaticityX,
                                        libwebm::kMkvPrimaryGChromaticityY);
  }
  if (b_) {
    size += b_->PrimaryChromaticitySize(libwebm::kMkvPrimaryBChromaticityX,
                                        libwebm::kMkvPrimaryBChromaticityY);
  }
  if (white_point_) {
    size += white_point_->PrimaryChromaticitySize(
        libwebm::kMkvWhitePointChromaticityX,
        libwebm::kMkvWhitePointChromaticityY);
  }

  return size;
}